

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_cmd_ln.c
# Opt level: O1

int parse_cmd_ln(int argc,char **argv)

{
  cmd_ln_t *pcVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  undefined8 *puVar5;
  byte bVar6;
  char examplestr [83];
  char helpstr [1937];
  undefined8 auStack_818 [10];
  undefined2 local_7c8;
  undefined1 local_7c6;
  undefined1 local_7b8 [1952];
  
  bVar6 = 0;
  memcpy(local_7b8,
         "Description: (copied from Rita\'s web page.) \n\nDeleted interpolation is the final step in creating semi-continuous \nmodels. The output of deleted interpolation are semi-continuous models \nin sphinx-3 format. These have to be further converted to sphinx-2 \nformat, if you want to use the SPHINX-II decoder. \n\nDeleted interpolation is an iterative process to interpolate between \nCD and CI mixture-weights to reduce the effects of overfitting. The \ndata are divided into two sets, and the data from one set are used to \nestimate the optimal interpolation factor between CI and CD models \ntrained from the other set. Then the two data sets are switched and \nthis procedure is repeated using the last estimated interpolation \nfactor as an initialization for the current step. The switching is \ncontinued until the interpolation factor converges.\n\nTo do this, we need *two* balanced data sets. Instead of the actual\ndata, however, we use the Bauim-Welch buffers, since the related math\nis convenient. we therefore need an *even* number of buffers that can\nbe grouped into two sets. DI cannot be performed if you train using\nonly one buffer. At least in the final iteration of the training, you\nmust perform the training in (at least) two parts. You could also do\nthis serially as one final iteration of training AFTER BW has\nconverged, on a non-lsf setup.\n\nNote here that the norm executable used at the end of every Baum-Welch \niteration also computes models from the buffers, but it does not\nrequire an even number of buffers. BW returns numerator terms and\ndenominator terms for the final estimation, and norm performs the\nactual division. The number of buffers is not important, but you would \nneed to run norm at the end of EVERY iteration of BW, even if you did\nthe training in only one part. When you have multiple parts norm sums\nup the numerator terms from the various buffers, and the denominator\nterms, and then does the division. "
         ,0x791);
  pcVar4 = "delint -accumdirs accumdir -moddeffn mdef -mixwfn mixw -cilambda 0.9 -maxiter 4000";
  puVar5 = auStack_818;
  for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar5 = *(undefined8 *)pcVar4;
    pcVar4 = pcVar4 + ((ulong)bVar6 * -2 + 1) * 8;
    puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
  }
  local_7c6 = 0;
  local_7c8 = 0x3030;
  cmd_ln_parse(parse_cmd_ln::defn,argc,argv,1);
  pcVar1 = cmd_ln_get();
  lVar3 = cmd_ln_int_r(pcVar1,"-help");
  pcVar1 = cmd_ln_get();
  lVar2 = cmd_ln_int_r(pcVar1,"-example");
  if ((int)lVar3 != 0) {
    printf("%s\n\n",local_7b8);
  }
  if ((int)lVar2 != 0) {
    printf("%s\n\n",auStack_818);
  }
  if ((int)lVar2 == 0 && (int)lVar3 == 0) {
    return 0;
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/parse_cmd_ln.c"
          ,0x9b,"User asked for help or example.\n");
  exit(0);
}

Assistant:

int
parse_cmd_ln(int argc, char *argv[])
{
  uint32      isHelp;
  uint32      isExample;

    const char helpstr[] =  
"Description: (copied from Rita's web page.) \n\
\n\
Deleted interpolation is the final step in creating semi-continuous \n\
models. The output of deleted interpolation are semi-continuous models \n\
in sphinx-3 format. These have to be further converted to sphinx-2 \n\
format, if you want to use the SPHINX-II decoder. \n\
\n\
Deleted interpolation is an iterative process to interpolate between \n\
CD and CI mixture-weights to reduce the effects of overfitting. The \n\
data are divided into two sets, and the data from one set are used to \n\
estimate the optimal interpolation factor between CI and CD models \n\
trained from the other set. Then the two data sets are switched and \n\
this procedure is repeated using the last estimated interpolation \n\
factor as an initialization for the current step. The switching is \n\
continued until the interpolation factor converges.\n\
\n\
To do this, we need *two* balanced data sets. Instead of the actual\n\
data, however, we use the Bauim-Welch buffers, since the related math\n\
is convenient. we therefore need an *even* number of buffers that can\n\
be grouped into two sets. DI cannot be performed if you train using\n\
only one buffer. At least in the final iteration of the training, you\n\
must perform the training in (at least) two parts. You could also do\n\
this serially as one final iteration of training AFTER BW has\n\
converged, on a non-lsf setup.\n\
\n\
Note here that the norm executable used at the end of every Baum-Welch \n\
iteration also computes models from the buffers, but it does not\n\
require an even number of buffers. BW returns numerator terms and\n\
denominator terms for the final estimation, and norm performs the\n\
actual division. The number of buffers is not important, but you would \n\
need to run norm at the end of EVERY iteration of BW, even if you did\n\
the training in only one part. When you have multiple parts norm sums\n\
up the numerator terms from the various buffers, and the denominator\n\
terms, and then does the division. ";

    const char examplestr[]=
"delint -accumdirs accumdir -moddeffn mdef -mixwfn mixw -cilambda 0.9 -maxiter 4000";

    static arg_t defn[] = {
	{ "-help",
	  ARG_BOOLEAN,
	  "no",
	  "Shows the usage of the tool"},

	{ "-example",
	  ARG_BOOLEAN,
	  "no",
	  "Shows example of how to use the tool"},

	{ "-moddeffn",
	  ARG_STRING,
	  NULL,
	  "The model definition file name"},
	{ "-mixwfn",
	  ARG_STRING,
	  NULL,
	  "The mixture weight parameter file name"},
	{ "-accumdirs",
	  ARG_STRING_LIST,
	  NULL,
	  "A path where accumulated counts are to be read." },
	{ "-cilambda",
	  ARG_FLOAT32,
	  "0.9",
	  "Weight of CI distributions with respect to uniform distribution"},
	{ "-maxiter",
	  ARG_INT32,
	  "100",
	  "max # of iterations if no lambda convergence"},

	{NULL, 0, NULL, NULL}
    };

    cmd_ln_parse(defn, argc, argv, 1);


    isHelp    = cmd_ln_int32("-help");
    isExample    = cmd_ln_int32("-example");

    if(isHelp){
      printf("%s\n\n",helpstr);
    }

    if(isExample){
      printf("%s\n\n",examplestr);
    }

    if(isHelp || isExample){
      E_INFO("User asked for help or example.\n");
      exit(0);
    }

    return 0;
}